

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O2

UniquePtr<SDL_Texture> * __thiscall
solitaire::graphics::SDLGraphicsSystemWithCreatedWindowTests::makeSDLTexture
          (UniquePtr<SDL_Texture> *__return_storage_ptr__,
          SDLGraphicsSystemWithCreatedWindowTests *this,SDL_Texture_conflict *ptr)

{
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  PtrDeleter local_58;
  function<void_(SDL_Texture_*)> local_48;
  
  std::__shared_ptr<solitaire::SDL::PtrDeleterMock,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<testing::StrictMock<solitaire::SDL::PtrDeleterMock>,void>
            ((__shared_ptr<solitaire::SDL::PtrDeleterMock,(__gnu_cxx::_Lock_policy)2> *)&local_68,
             &(this->super_SDLGraphicsSystemTests).ptrDeleterMock.
              super___shared_ptr<testing::StrictMock<solitaire::SDL::PtrDeleterMock>,_(__gnu_cxx::_Lock_policy)2>
            );
  local_58.mock.super___shared_ptr<solitaire::SDL::PtrDeleterMock,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_68;
  local_58.mock.super___shared_ptr<solitaire::SDL::PtrDeleterMock,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_60._M_pi;
  local_68 = (element_type *)0x0;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::function<void(SDL_Texture*)>::function<solitaire::SDL::PtrDeleter,void>
            ((function<void(SDL_Texture*)> *)&local_48,&local_58);
  std::__uniq_ptr_impl<SDL_Texture,std::function<void(SDL_Texture*)>>::
  __uniq_ptr_impl<std::function<void(SDL_Texture*)>>
            ((__uniq_ptr_impl<SDL_Texture,std::function<void(SDL_Texture*)>> *)
             __return_storage_ptr__,ptr,&local_48);
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.mock.
              super___shared_ptr<solitaire::SDL::PtrDeleterMock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
  return __return_storage_ptr__;
}

Assistant:

UniquePtr<SDL_Texture> makeSDLTexture(SDL_Texture* ptr) {
        return UniquePtr<SDL_Texture> {ptr, PtrDeleter {ptrDeleterMock}};
    }